

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::MergePartialFromCodedStream
          (FeatureVectorizer_InputColumn *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  string *psVar6;
  ulong uVar7;
  
LAB_005794fc:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0057951f;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0057951f:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_0057959f:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_005795b8:
      if (bVar3 == false) {
        return false;
      }
      goto LAB_005794fc;
    }
    uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
    if (uVar5 == 2) {
      if ((char)uVar7 != '\x10') goto LAB_0057959f;
      bVar3 = google::protobuf::io::CodedInputStream::ReadVarint64(input,&this->inputdimensions_);
      goto LAB_005795b8;
    }
    if ((uVar5 != 1) || ((char)uVar7 != '\n')) goto LAB_0057959f;
    psVar6 = mutable_inputcolumn_abi_cxx11_(this);
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar3) {
      return false;
    }
    psVar6 = (this->inputcolumn_).ptr_;
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                       "CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn");
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool FeatureVectorizer_InputColumn::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FeatureVectorizer.InputColumn)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string inputColumn = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_inputcolumn()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->inputcolumn().data(), this->inputcolumn().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.FeatureVectorizer.InputColumn.inputColumn"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 inputDimensions = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputdimensions_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FeatureVectorizer.InputColumn)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FeatureVectorizer.InputColumn)
  return false;
#undef DO_
}